

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

bool Am_Inter_Call_Both_Method
               (Am_Object *inter,Am_Object *command_obj,Am_Slot_Key method_slot,int x,int y,
               Am_Object *ref_obj,Am_Input_Char *ic,Am_Object *object_modified,
               Am_Inter_Location *points)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value state;
  
  Am_Inter_Call_Method(inter,method_slot,x,y,ref_obj,ic,object_modified,points);
  state.type = 0;
  state.value.wrapper_value = (Am_Wrapper *)0x0;
  bVar1 = Am_Object::Valid(inter);
  if (bVar1) {
    pAVar3 = Am_Object::Get(inter,0x123,1);
    Am_Value::operator=(&state,pAVar3);
    bVar1 = Am_Value::Exists(&state);
    if (bVar1) {
      iVar2 = Am_Value::operator_cast_to_int(&state);
      if ((method_slot == 0xc9) || (iVar2 != 3)) {
        Am_Inter_Call_Method(command_obj,method_slot,x,y,ref_obj,ic,object_modified,points);
        bVar1 = Am_Object::Valid(inter);
        if (bVar1) {
          pAVar3 = Am_Object::Get(inter,0x123,1);
          Am_Value::operator=(&state,pAVar3);
          bVar1 = Am_Value::Exists(&state);
          if (bVar1) {
            iVar2 = Am_Value::operator_cast_to_int(&state);
            bVar1 = iVar2 != 3;
            goto LAB_001b911d;
          }
        }
      }
    }
  }
  bVar1 = false;
LAB_001b911d:
  Am_Value::~Am_Value(&state);
  return bVar1;
}

Assistant:

bool
Am_Inter_Call_Both_Method(Am_Object &inter, Am_Object &command_obj,
                          Am_Slot_Key method_slot, int x, int y,
                          Am_Object &ref_obj, Am_Input_Char &ic,
                          Am_Object &object_modified, Am_Inter_Location &points)
{
  Am_Inter_Call_Method(inter, method_slot, x, y, ref_obj, ic, object_modified,
                       points);
  Am_Value state;
  //method might destroy interactor, so be cautious
  if (!inter.Valid())
    return false;
  state = inter.Peek(Am_CURRENT_STATE);
  //see if that method destroyed the interactor or aborted it when not
  //doing the abort method
  if (!state.Exists() ||
      ((int)state == Am_INTER_ABORTING && method_slot != Am_ABORT_DO_METHOD))
    return false;
  // otherwise, continue

  Am_Inter_Call_Method(command_obj, method_slot, x, y, ref_obj, ic,
                       object_modified, points);
  //method might destroy interactor, so be cautious
  if (!inter.Valid())
    return false;

  state = inter.Peek(Am_CURRENT_STATE);
  if (!state.Exists() || (int)state == Am_INTER_ABORTING)
    return false;
  else
    return true;
}